

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void * ym2203_init(void *param,UINT32 clock,UINT32 rate,FM_TIMERHANDLER timer_handler,
                  FM_IRQHANDLER IRQHandler)

{
  void *chip;
  
  chip = calloc(1,0x4b40);
  if (chip != (void *)0x0) {
    init_tables();
    *(void **)((long)chip + 0x110) = param;
    *(undefined1 *)((long)chip + 0x108) = 1;
    *(long *)((long)chip + 0x5a0) = (long)chip + 0x4678;
    *(UINT32 *)((long)chip + 0x118) = clock;
    *(UINT32 *)((long)chip + 0x11c) = rate;
    OPNCheckNativeSampleRate((FM_OPN *)((long)chip + 0x108));
    *(FM_TIMERHANDLER *)((long)chip + 0x548) = timer_handler;
    *(FM_IRQHANDLER *)((long)chip + 0x550) = IRQHandler;
    *(code **)((long)chip + 0x558) = ssgdummy_set_clock;
    *(code **)((long)chip + 0x560) = ssgdummy_write;
    *(code **)((long)chip + 0x568) = ssgdummy_read;
    *(code **)((long)chip + 0x570) = ssgdummy_reset;
    *(undefined8 *)((long)chip + 0x578) = 0;
    *(undefined8 *)((long)chip + 18000) = 0;
    *(undefined8 *)((long)chip + 0x4658) = 0;
    ym2203_set_mute_mask(chip,0);
  }
  return chip;
}

Assistant:

void * ym2203_init(void *param, UINT32 clock, UINT32 rate,
				FM_TIMERHANDLER timer_handler,FM_IRQHANDLER IRQHandler)
{
	YM2203 *F2203;

	/* allocate ym2203 state space */
	F2203 = (YM2203 *)calloc(1,sizeof(YM2203));
	if( F2203==NULL)
		return NULL;

	/* allocate total level table (128kb space) */
	init_tables();

	F2203->OPN.ST.param = param;
	F2203->OPN.type = TYPE_YM2203;
	F2203->OPN.P_CH = F2203->CH;
	F2203->OPN.ST.clock = clock;
	F2203->OPN.ST.rate = rate;
	OPNCheckNativeSampleRate(&F2203->OPN);

	F2203->OPN.ST.timer_handler = timer_handler;
	F2203->OPN.ST.IRQ_Handler   = IRQHandler;
	OPNLinkSSG(&F2203->OPN, NULL, NULL);
	OPNSetSmplRateChgCallback(&F2203->OPN, NULL, NULL);

	ym2203_set_mute_mask(F2203, 0x00);

	return F2203;
}